

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::LogTestSummary
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed,cmDuration *durationInSecs)

{
  pointer pbVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  string *this_00;
  float fVar7;
  float local_614;
  string local_610;
  string failedColorCode;
  string passColorCode;
  ostringstream cmCTestLog_msg_1;
  char realBuf [1024];
  
  uVar6 = (long)(passed->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(passed->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  pbVar1 = (failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  passColorCode._M_dataplus._M_p = (pointer)&passColorCode.field_2;
  passColorCode._M_string_length = 0;
  passColorCode.field_2._M_local_buf[0] = '\0';
  failedColorCode._M_string_length = 0;
  fVar7 = ((float)uVar6 * 100.0) / (float)(((long)pbVar1 - (long)pbVar2 >> 5) + uVar6);
  local_614 = fVar7;
  if ((pbVar1 != pbVar2) && (local_614 = 99.0, fVar7 <= 99.0)) {
    local_614 = fVar7;
  }
  failedColorCode._M_dataplus._M_p = (pointer)&failedColorCode.field_2;
  failedColorCode.field_2._M_local_buf[0] = '\0';
  if (pbVar1 == pbVar2) {
    cmCTest::GetColorCode_abi_cxx11_
              ((string *)realBuf,(this->super_cmCTestGenericHandler).CTest,GREEN);
    this_00 = &passColorCode;
  }
  else {
    cmCTest::GetColorCode_abi_cxx11_
              ((string *)realBuf,(this->super_cmCTestGenericHandler).CTest,RED);
    this_00 = &failedColorCode;
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)realBuf);
  std::__cxx11::string::~string((string *)realBuf);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)realBuf);
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)realBuf);
  poVar5 = std::operator<<(poVar5,(string *)&passColorCode);
  lroundf(local_614);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::operator<<(poVar5,"% tests passed");
  cmCTest::GetColorCode_abi_cxx11_
            ((string *)&cmCTestLog_msg_1,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR);
  poVar5 = std::operator<<(poVar5,(string *)&cmCTestLog_msg_1);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&failedColorCode);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," tests failed");
  cmCTest::GetColorCode_abi_cxx11_(&local_610,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR)
  ;
  poVar5 = std::operator<<(poVar5,(string *)&local_610);
  poVar5 = std::operator<<(poVar5," out of ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x264,_cmCTestLog_msg_1,false);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)realBuf);
  cmCTest::GetLabelsForSubprojects_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)realBuf,(this->super_cmCTestGenericHandler).CTest);
  if (realBuf._0_8_ == realBuf._8_8_) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)realBuf);
  }
  else {
    bVar4 = cmCTest::GetSubprojectSummary((this->super_cmCTestGenericHandler).CTest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)realBuf);
    if (bVar4) {
      PrintLabelOrSubprojectSummary(this,true);
    }
  }
  bVar4 = cmCTest::GetLabelSummary((this->super_cmCTestGenericHandler).CTest);
  if (bVar4) {
    PrintLabelOrSubprojectSummary(this,false);
  }
  snprintf(realBuf,0x400,"%6.2f sec",durationInSecs->__r);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_1,"\nTotal Test time (real) = ");
  poVar5 = std::operator<<(poVar5,realBuf);
  std::operator<<(poVar5,"\n");
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x270,local_610._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
  std::__cxx11::string::~string((string *)&failedColorCode);
  std::__cxx11::string::~string((string *)&passColorCode);
  return;
}

Assistant:

void cmCTestTestHandler::LogTestSummary(const std::vector<std::string>& passed,
                                        const std::vector<std::string>& failed,
                                        const cmDuration& durationInSecs)
{
  std::size_t total = passed.size() + failed.size();

  float percent =
    static_cast<float>(passed.size()) * 100.0f / static_cast<float>(total);
  if (!failed.empty() && percent > 99) {
    percent = 99;
  }

  std::string passColorCode;
  std::string failedColorCode;
  if (failed.empty()) {
    passColorCode = this->CTest->GetColorCode(cmCTest::Color::GREEN);
  } else {
    failedColorCode = this->CTest->GetColorCode(cmCTest::Color::RED);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::endl
               << passColorCode << std::lround(percent) << "% tests passed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << ", " << failedColorCode << failed.size() << " tests failed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << " out of " << total << std::endl);
  if ((!this->CTest->GetLabelsForSubprojects().empty() &&
       this->CTest->GetSubprojectSummary())) {
    this->PrintLabelOrSubprojectSummary(true);
  }
  if (this->CTest->GetLabelSummary()) {
    this->PrintLabelOrSubprojectSummary(false);
  }
  char realBuf[1024];
  snprintf(realBuf, sizeof(realBuf), "%6.2f sec", durationInSecs.count());
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "\nTotal Test time (real) = " << realBuf << "\n",
                     this->Quiet);
}